

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O1

idx_t duckdb::DBConfig::ParseMemoryLimit(string *arg)

{
  byte bVar1;
  TryCast *this;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  pointer pcVar5;
  InvalidInputException *this_00;
  ParserException *pPVar6;
  undefined8 uVar7;
  uint uVar8;
  ulong uVar9;
  undefined1 in_R8B;
  long lVar10;
  long lVar11;
  ulong uVar12;
  idx_t iVar13;
  double dVar14;
  string_t input;
  string_t input_00;
  string unit;
  double result;
  string number;
  string local_d8;
  uint local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  string local_a8;
  pointer local_88;
  undefined8 uStack_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined4 *local_50;
  uint local_48;
  undefined4 local_40 [4];
  
  iVar13 = 0xffffffffffffffff;
  if (((*(arg->_M_dataplus)._M_p != '-') &&
      (iVar4 = ::std::__cxx11::string::compare((char *)arg), iVar4 != 0)) &&
     (iVar4 = ::std::__cxx11::string::compare((char *)arg), iVar4 != 0)) {
    pcVar5 = (arg->_M_dataplus)._M_p;
    for (lVar11 = 0; ((byte)pcVar5[lVar11] - 9 < 5 || (pcVar5[lVar11] == 0x20)); lVar11 = lVar11 + 1
        ) {
    }
    lVar10 = 0;
    while (((byte)(pcVar5[lVar11] - 0x30U) < 10 ||
           ((uVar8 = (byte)pcVar5[lVar11] - 0x2d, uVar8 < 0x39 &&
            ((0x100000001000003U >> ((ulong)uVar8 & 0x3f) & 1) != 0))))) {
      lVar10 = lVar10 + -1;
      pcVar5 = pcVar5 + 1;
    }
    if (lVar10 == 0) {
      pPVar6 = (ParserException *)__cxa_allocate_exception(0x10);
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d8,"Memory limit must have a number (e.g. SET memory_limit=1GB",""
                );
      ParserException::ParserException(pPVar6,&local_d8);
      __cxa_throw(pPVar6,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
    ::std::__cxx11::string::substr((ulong)&local_50,(ulong)arg);
    local_b8 = local_48;
    if (local_48 < 0xd) {
      uStack_ac = 0;
      uStack_b4 = 0;
      uStack_b0 = 0;
      if (local_48 != 0) {
        switchD_015ff80e::default(&uStack_b4,local_50,(ulong)(local_48 & 0xf));
      }
    }
    else {
      uStack_b4 = *local_50;
      uStack_b0 = SUB84(local_50,0);
      uStack_ac = (undefined4)((ulong)local_50 >> 0x20);
    }
    this = (TryCast *)CONCAT44(uStack_b4,local_b8);
    uVar2 = CONCAT44(uStack_ac,uStack_b0);
    uVar7 = 0;
    input_00.value.pointer.ptr = (char *)&local_a8;
    input_00.value._0_8_ = uVar2;
    bVar3 = TryCast::Operation<duckdb::string_t,double>(this,input_00,(double *)0x0,(bool)in_R8B);
    if (!bVar3) {
      this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      input.value.pointer.ptr = (char *)uVar7;
      input.value._0_8_ = uVar2;
      CastExceptionText<duckdb::string_t,double>(&local_d8,(duckdb *)this,input);
      InvalidInputException::InvalidInputException(this_00,&local_d8);
      __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pcVar5 = (arg->_M_dataplus)._M_p;
    for (uVar12 = lVar11 - lVar10; (bVar1 = pcVar5[uVar12], bVar1 - 9 < 5 || (bVar1 == 0x20));
        uVar12 = uVar12 + 1) {
    }
    while ((uVar12 < arg->_M_string_length &&
           ((uVar9 = (ulong)(byte)pcVar5[uVar12], 0x20 < uVar9 ||
            ((0x100003e00U >> (uVar9 & 0x3f) & 1) == 0))))) {
      uVar12 = uVar12 + 1;
    }
    iVar13 = 0xffffffffffffffff;
    if (0.0 <= (double)local_a8._M_dataplus._M_p) {
      local_88 = local_a8._M_dataplus._M_p;
      uStack_80 = 0;
      ::std::__cxx11::string::substr((ulong)&local_a8,(ulong)arg);
      StringUtil::Lower(&local_d8,&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p);
      }
      iVar4 = ::std::__cxx11::string::compare((char *)&local_d8);
      dVar14 = 1.0;
      if (iVar4 != 0) {
        iVar4 = ::std::__cxx11::string::compare((char *)&local_d8);
        if (iVar4 == 0) {
          dVar14 = 1.0;
        }
        else {
          iVar4 = ::std::__cxx11::string::compare((char *)&local_d8);
          dVar14 = 1.0;
          if (iVar4 != 0) {
            iVar4 = ::std::__cxx11::string::compare((char *)&local_d8);
            dVar14 = 1000.0;
            if (iVar4 != 0) {
              iVar4 = ::std::__cxx11::string::compare((char *)&local_d8);
              if ((iVar4 == 0) ||
                 (iVar4 = ::std::__cxx11::string::compare((char *)&local_d8), iVar4 == 0)) {
                dVar14 = 1000.0;
              }
              else {
                iVar4 = ::std::__cxx11::string::compare((char *)&local_d8);
                dVar14 = 1000.0;
                if (iVar4 != 0) {
                  iVar4 = ::std::__cxx11::string::compare((char *)&local_d8);
                  dVar14 = 1000000.0;
                  if (iVar4 != 0) {
                    iVar4 = ::std::__cxx11::string::compare((char *)&local_d8);
                    if ((iVar4 == 0) ||
                       (iVar4 = ::std::__cxx11::string::compare((char *)&local_d8), iVar4 == 0)) {
                      dVar14 = 1000000.0;
                    }
                    else {
                      iVar4 = ::std::__cxx11::string::compare((char *)&local_d8);
                      dVar14 = 1000000.0;
                      if (iVar4 != 0) {
                        iVar4 = ::std::__cxx11::string::compare((char *)&local_d8);
                        dVar14 = 1000000000.0;
                        if (iVar4 != 0) {
                          iVar4 = ::std::__cxx11::string::compare((char *)&local_d8);
                          if ((iVar4 == 0) ||
                             (iVar4 = ::std::__cxx11::string::compare((char *)&local_d8), iVar4 == 0
                             )) {
                            dVar14 = 1000000000.0;
                          }
                          else {
                            iVar4 = ::std::__cxx11::string::compare((char *)&local_d8);
                            dVar14 = 1000000000.0;
                            if (iVar4 != 0) {
                              iVar4 = ::std::__cxx11::string::compare((char *)&local_d8);
                              if (((iVar4 == 0) ||
                                  (iVar4 = ::std::__cxx11::string::compare((char *)&local_d8),
                                  iVar4 == 0)) ||
                                 (iVar4 = ::std::__cxx11::string::compare((char *)&local_d8),
                                 iVar4 == 0)) {
                                dVar14 = 1000000000000.0;
                              }
                              else {
                                iVar4 = ::std::__cxx11::string::compare((char *)&local_d8);
                                dVar14 = 1000000000000.0;
                                if (iVar4 != 0) {
                                  iVar4 = ::std::__cxx11::string::compare((char *)&local_d8);
                                  if (iVar4 == 0) {
                                    dVar14 = 1024.0;
                                  }
                                  else {
                                    iVar4 = ::std::__cxx11::string::compare((char *)&local_d8);
                                    if (iVar4 == 0) {
                                      dVar14 = 1048576.0;
                                    }
                                    else {
                                      iVar4 = ::std::__cxx11::string::compare((char *)&local_d8);
                                      if (iVar4 == 0) {
                                        dVar14 = 1073741824.0;
                                      }
                                      else {
                                        iVar4 = ::std::__cxx11::string::compare((char *)&local_d8);
                                        if (iVar4 != 0) {
                                          pPVar6 = (ParserException *)__cxa_allocate_exception(0x10)
                                          ;
                                          local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
                                          ::std::__cxx11::string::_M_construct<char_const*>
                                                    ((string *)&local_a8,
                                                                                                          
                                                  "Unknown unit for memory_limit: \'%s\' (expected: KB, MB, GB, TB for 1000^i units or KiB, MiB, GiB, TiB for 1024^i units)"
                                                  ,"");
                                          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
                                          ::std::__cxx11::string::_M_construct<char*>
                                                    ((string *)&local_70,local_d8._M_dataplus._M_p,
                                                     local_d8._M_dataplus._M_p +
                                                     local_d8._M_string_length);
                                          ParserException::ParserException<std::__cxx11::string>
                                                    (pPVar6,&local_a8,&local_70);
                                          __cxa_throw(pPVar6,&ParserException::typeinfo,
                                                      ::std::runtime_error::~runtime_error);
                                        }
                                        dVar14 = 1099511627776.0;
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      dVar14 = (double)local_88 * dVar14;
      uVar12 = (ulong)dVar14;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      iVar13 = uVar12 | (long)(dVar14 - 9.223372036854776e+18) & (long)uVar12 >> 0x3f;
    }
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
  }
  return iVar13;
}

Assistant:

vector<std::string> DBConfig::GetOptionNames() {
	vector<string> names;
	for (idx_t i = 0, option_count = DBConfig::GetOptionCount(); i < option_count; i++) {
		names.emplace_back(DBConfig::GetOptionByIndex(i)->name);
	}
	return names;
}